

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O1

CachedResourceView * __thiscall
Diligent::ShaderResourceCacheGL::GetConstImage(ShaderResourceCacheGL *this,Uint32 CacheOffset)

{
  char (*in_R8) [18];
  string msg;
  Uint32 local_34;
  string local_30;
  
  local_34 = CacheOffset;
  if ((uint)(((ulong)this->m_SSBOsOffset - (ulong)this->m_ImagesOffset) / 0x18) <= CacheOffset) {
    FormatString<char[21],unsigned_int,char[18]>
              (&local_30,(Diligent *)"Image buffer index (",(char (*) [21])&local_34,
               (uint *)") is out of range",in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetConstImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0x134);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return (CachedResourceView *)
         ((this->m_pResourceData)._M_t.
          super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
          ._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
         (ulong)local_34 * 0x18 + (ulong)this->m_ImagesOffset);
}

Assistant:

const CachedResourceView& GetConstImage(Uint32 CacheOffset) const
    {
        VERIFY(CacheOffset < GetImageCount(), "Image buffer index (", CacheOffset, ") is out of range");
        return reinterpret_cast<CachedResourceView*>(m_pResourceData.get() + m_ImagesOffset)[CacheOffset];
    }